

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O2

bool tinyusdz::is_valid_utf8(string *str)

{
  ulong uVar1;
  ulong uVar2;
  uint32_t uVar3;
  ulong uVar4;
  
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    uVar1 = str->_M_string_length;
    if (uVar1 <= uVar4) break;
    uVar3 = detail::utf8_len((str->_M_dataplus)._M_p[uVar4]);
    uVar2 = uVar3 + uVar4;
  } while (uVar3 != 0);
  return uVar1 <= uVar4;
}

Assistant:

bool is_valid_utf8(const std::string &str) {
  // TODO: Consider UTF-BOM?
  for (size_t i = 0; i < str.size();) {
    uint32_t len = detail::utf8_len(*reinterpret_cast<const unsigned char *>(&str[i]));
    if (len == 0) {
      return false;
    }
    i += len;
  }
  return true;
}